

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

int ChecksumLength(ChecksumType method)

{
  int local_c;
  ChecksumType method_local;
  
  if (method == None) {
LAB_0020602b:
    local_c = 0;
  }
  else {
    if (method != Constant_8C15) {
      if (method - Sum_1800 < 3) {
        return 1;
      }
      if (1 < method - CRC_D2F6_1800) goto LAB_0020602b;
    }
    local_c = 2;
  }
  return local_c;
}

Assistant:

int ChecksumLength(ChecksumType method)
{
    switch (method)
    {
    case ChecksumType::None:
        break;
    case ChecksumType::Sum_1800:
    case ChecksumType::XOR_1800:
    case ChecksumType::XOR_18A0:
        return 1;
    case ChecksumType::Constant_8C15:
    case ChecksumType::CRC_D2F6_1800:
    case ChecksumType::CRC_D2F6_1802:
        return 2;
    }

    return 0;
}